

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzsparseblockdiagonal.cpp
# Opt level: O3

void __thiscall
TPZSparseBlockDiagonal<float>::BuildFromMatrix
          (TPZSparseBlockDiagonal<float> *this,TPZMatrix<float> *matrix)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  long lVar5;
  long newsize;
  long i;
  bool bVar6;
  TPZManVector<long,_10> indices;
  TPZManVector<long,_10> TStack_9d78;
  TPZFMatrix<float> local_9d08;
  float local_9c78 [10002];
  
  TPZManVector<long,_10>::TPZManVector(&TStack_9d78,0);
  local_9d08.fElem = local_9c78;
  local_9d08.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = 0;
  local_9d08.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 0;
  local_9d08.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_9d08.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_9d08.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_0185c1f8;
  local_9d08.fSize = 10000;
  local_9d08.fGiven = local_9d08.fElem;
  TPZVec<int>::TPZVec(&local_9d08.fPivot.super_TPZVec<int>,0);
  local_9d08.fPivot.super_TPZVec<int>.fStore = local_9d08.fPivot.fExtAlloc;
  local_9d08.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_9d08.fPivot.super_TPZVec<int>.fNElements = 0;
  local_9d08.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_9d08.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813d70;
  local_9d08.fWork.fStore = (float *)0x0;
  local_9d08.fWork.fNElements = 0;
  local_9d08.fWork.fNAlloc = 0;
  local_9d08.fElem = (float *)0x0;
  local_9d08.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_0185bf08;
  lVar2 = (this->fBlockIndex).fNElements;
  if (1 < lVar2) {
    i = 0;
    do {
      iVar1 = (this->super_TPZBlockDiagonal<float>).fBlockSize.fStore[i];
      newsize = (long)iVar1;
      TPZManVector<long,_10>::Resize(&TStack_9d78,newsize);
      TPZFMatrix<float>::Resize(&local_9d08,newsize,newsize);
      if (0 < iVar1) {
        lVar3 = (this->fBlockIndex).fStore[i];
        plVar4 = (this->fBlock).fStore;
        lVar5 = 0;
        do {
          TStack_9d78.super_TPZVec<long>.fStore[lVar5] = plVar4[lVar3 + lVar5];
          lVar5 = lVar5 + 1;
        } while (newsize != lVar5);
      }
      (*(matrix->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x49])
                (matrix,&TStack_9d78,&local_9d08);
      TPZBlockDiagonal<float>::SetBlock(&this->super_TPZBlockDiagonal<float>,i,&local_9d08);
      bVar6 = i != lVar2 + -2;
      i = i + 1;
    } while (bVar6);
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_9d08,&PTR_PTR_0185c1c0);
  TPZManVector<long,_10>::~TPZManVector(&TStack_9d78);
  return;
}

Assistant:

void TPZSparseBlockDiagonal<TVar>::BuildFromMatrix(TPZMatrix<TVar>& matrix)
{
#ifdef PZ_LOG
	LOGPZ_DEBUG(logger, "TPZSparseBlockDiagonal::BuildFromMatrix");
#endif
	TPZManVector<int64_t> indices;
	TPZFNMatrix<10000,TVar> submat(0,0);
	int64_t ibl,nbl = fBlockIndex.NElements()-1;
	for(ibl=0; ibl<nbl; ibl++)
	{
		int64_t nel = this->fBlockSize[ibl];
		indices.Resize(nel);
		submat.Resize(nel,nel);
		int64_t iel,first = fBlockIndex[ibl];
		for(iel=0; iel<nel; iel++) indices[iel] = fBlock[first+iel];
		matrix.GetSub(indices,submat);
		this->SetBlock(ibl,submat);
	}
}